

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGenGrid2D.cpp
# Opt level: O3

void __thiscall
TPZGenGrid2D::TPZGenGrid2D
          (TPZGenGrid2D *this,TPZVec<int> *nx,TPZVec<double> *x0,TPZVec<double> *x1,int numl,
          REAL rot)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  double *pdVar5;
  double *pdVar6;
  int *piVar7;
  double *pdVar8;
  ulong uVar9;
  double local_38;
  
  this->_vptr_TPZGenGrid2D = (_func_int **)&PTR__TPZGenGrid2D_019e11a8;
  (this->fNx).super_TPZVec<int>.fStore = (int *)0x0;
  (this->fNx).super_TPZVec<int>.fNElements = 0;
  (this->fNx).super_TPZVec<int>.fNAlloc = 0;
  (this->fNx).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181a018;
  uVar3 = nx->fNElements;
  if ((long)uVar3 < 0xb) {
    piVar7 = (this->fNx).fExtAlloc;
    (this->fNx).super_TPZVec<int>.fStore = piVar7;
    (this->fNx).super_TPZVec<int>.fNElements = uVar3;
    (this->fNx).super_TPZVec<int>.fNAlloc = 0;
    if (0 < (long)uVar3) goto LAB_01429976;
  }
  else {
    piVar7 = (int *)operator_new__(-(ulong)(uVar3 >> 0x3e != 0) | uVar3 * 4);
    (this->fNx).super_TPZVec<int>.fStore = piVar7;
    (this->fNx).super_TPZVec<int>.fNElements = uVar3;
    (this->fNx).super_TPZVec<int>.fNAlloc = uVar3;
LAB_01429976:
    piVar4 = nx->fStore;
    uVar9 = 0;
    do {
      piVar7[uVar9] = piVar4[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar3 != uVar9);
  }
  (this->fX0).super_TPZVec<double>.fStore = (double *)0x0;
  (this->fX0).super_TPZVec<double>.fNElements = 0;
  (this->fX0).super_TPZVec<double>.fNAlloc = 0;
  (this->fX0).super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181a198;
  uVar3 = x0->fNElements;
  if ((long)uVar3 < 0xb) {
    pdVar8 = (this->fX0).fExtAlloc;
    (this->fX0).super_TPZVec<double>.fStore = pdVar8;
    (this->fX0).super_TPZVec<double>.fNElements = uVar3;
    (this->fX0).super_TPZVec<double>.fNAlloc = 0;
    if (0 < (long)uVar3) goto LAB_01429a06;
  }
  else {
    pdVar8 = (double *)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 * 8);
    (this->fX0).super_TPZVec<double>.fStore = pdVar8;
    (this->fX0).super_TPZVec<double>.fNElements = uVar3;
    (this->fX0).super_TPZVec<double>.fNAlloc = uVar3;
LAB_01429a06:
    pdVar5 = x0->fStore;
    uVar9 = 0;
    do {
      pdVar8[uVar9] = pdVar5[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar3 != uVar9);
  }
  (this->fX1).super_TPZVec<double>.fStore = (double *)0x0;
  (this->fX1).super_TPZVec<double>.fNElements = 0;
  (this->fX1).super_TPZVec<double>.fNAlloc = 0;
  (this->fX1).super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181a198;
  uVar3 = x1->fNElements;
  if ((long)uVar3 < 0xb) {
    pdVar8 = (this->fX1).fExtAlloc;
    (this->fX1).super_TPZVec<double>.fStore = pdVar8;
    (this->fX1).super_TPZVec<double>.fNElements = uVar3;
    (this->fX1).super_TPZVec<double>.fNAlloc = 0;
    if ((long)uVar3 < 1) goto LAB_01429abf;
  }
  else {
    pdVar8 = (double *)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 * 8);
    (this->fX1).super_TPZVec<double>.fStore = pdVar8;
    (this->fX1).super_TPZVec<double>.fNElements = uVar3;
    (this->fX1).super_TPZVec<double>.fNAlloc = uVar3;
  }
  pdVar5 = x1->fStore;
  uVar9 = 0;
  do {
    pdVar8[uVar9] = pdVar5[uVar9];
    uVar9 = uVar9 + 1;
  } while (uVar3 != uVar9);
LAB_01429abf:
  TPZManVector<double,_10>::TPZManVector(&this->fDelx,2);
  local_38 = 1.0;
  TPZManVector<double,_10>::TPZManVector(&this->fGeometricProgression,2,&local_38);
  this->fNumLayers = numl;
  this->fRotAngle = rot;
  this->fZigZag = false;
  this->fTrapeze = false;
  this->fDistortion = 0.0;
  this->fRefPattern = false;
  pdVar8 = x1->fStore;
  pdVar5 = x0->fStore;
  piVar7 = nx->fStore;
  iVar1 = *piVar7;
  pdVar6 = (this->fDelx).super_TPZVec<double>.fStore;
  *pdVar6 = (*pdVar8 - *pdVar5) / (double)iVar1;
  iVar2 = piVar7[1];
  pdVar6[1] = (pdVar8[1] - pdVar5[1]) / (double)iVar2;
  this->fNumNodes = (long)((iVar1 + (numl + -1) * iVar1 + 1) * (iVar2 + 1));
  this->fMeshType = EQuadrilateral;
  return;
}

Assistant:

TPZGenGrid2D::TPZGenGrid2D(const TPZVec<int> &nx, const TPZVec<REAL> &x0, const TPZVec<REAL> &x1, int numl, REAL rot) : fNx(nx), fX0(x0), fX1(x1),
fDelx(2), fGeometricProgression(2, 1.), fNumLayers(numl), fRotAngle(rot), fZigZag(false), fTrapeze(false), fDistortion(0.), fRefPattern(false) {
    fDelx[0] = (x1[0] - x0[0]) / (nx[0]); // Delta x
    fDelx[1] = (x1[1] - x0[1]) / (nx[1]); // Delta y
    fNumNodes = (nx[0] + 1)*(nx[1] + 1)+(fNumLayers - 1)*(nx[0])*(nx[1] + 1);
    fMeshType = MMeshType::EQuadrilateral;
}